

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cvars.cpp
# Opt level: O0

FBaseCVar * cvar_set(char *var_name,char *val)

{
  FBaseCVar *this;
  UCVarValue value;
  FBaseCVar *var;
  char *val_local;
  char *var_name_local;
  
  this = FindCVar(var_name,(FBaseCVar **)0x0);
  if (this != (FBaseCVar *)0x0) {
    FBaseCVar::SetGenericRep(this,(UCVarValue)val,CVAR_String);
  }
  return this;
}

Assistant:

FBaseCVar *cvar_set (const char *var_name, const char *val)
{
	FBaseCVar *var;

	if ( (var = FindCVar (var_name, NULL)) )
	{
		UCVarValue value;
		value.String = const_cast<char *>(val);
		var->SetGenericRep (value, CVAR_String);
	}

	return var;
}